

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  long lVar2;
  char16_t *string2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  hash_t hashCode;
  DictionaryStats *this_00;
  
  lVar1 = *(long *)this;
  uVar3 = 0;
  if (lVar1 != 0) {
    if ((ulong)key->len == 0) {
      hashCode = 0x2393b8b;
    }
    else {
      uVar6 = 0x811c9dc5;
      uVar5 = 0;
      do {
        uVar7 = (ushort)(key->string).ptr[uVar5] ^ uVar6;
        uVar6 = uVar7 * 0x1000193;
        uVar5 = uVar5 + 1;
      } while (key->len != uVar5);
      hashCode = uVar7 * 0x2000326 + 1;
    }
    uVar3 = BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar1 + (ulong)uVar3 * 4);
    uVar3 = 0;
    if (-1 < (int)uVar6) {
      lVar1 = *(long *)(this + 8);
      uVar3 = 0;
      do {
        lVar2 = *(long *)(lVar1 + 0x18 + (ulong)uVar6 * 0x20);
        if (((*(char *)(lVar2 + 0x12) == '\0') &&
            (uVar7 = *(uint *)(lVar2 + 0x14) >> 1, uVar7 == key->len)) &&
           (0xf < *(uint *)(lVar2 + 8))) {
          string2 = (key->string).ptr;
          if ((char16_t *)(lVar2 + 0x18) != string2) {
            iVar4 = PAL_wmemcmp((char16_t *)(lVar2 + 0x18),string2,(ulong)uVar7);
            if (iVar4 != 0) goto LAB_00dbcba9;
          }
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00dbcbc5;
        }
LAB_00dbcba9:
        uVar3 = uVar3 + 1;
        uVar6 = *(uint *)((ulong)uVar6 * 0x20 + lVar1 + 0x10);
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar6 = 0xffffffff;
LAB_00dbcbc5:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return uVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }